

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateExport.cpp
# Opt level: O0

HelicsPublication helicsFederateGetPublication(HelicsFederate fed,char *key,HelicsError *err)

{
  bool bVar1;
  element_type *this;
  HelicsError *in_RDX;
  string_view in_stack_00000000;
  Publication *in_stack_00000030;
  HelicsFederate in_stack_00000038;
  Publication *pub;
  shared_ptr<helics::ValueFederate> fedObj;
  undefined7 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8f;
  HelicsError *in_stack_ffffffffffffff90;
  HelicsFederate in_stack_ffffffffffffff98;
  __shared_ptr local_30 [16];
  HelicsError *local_20;
  ValueFederate *in_stack_fffffffffffffff8;
  HelicsPublication pvVar2;
  
  local_20 = in_RDX;
  getValueFedSharedPtr(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  bVar1 = std::__shared_ptr::operator_cast_to_bool(local_30);
  if (bVar1) {
    this = std::__shared_ptr_access<helics::ValueFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<helics::ValueFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1cd61b);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)this,
               (char *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
    helics::ValueFederate::getPublication(in_stack_fffffffffffffff8,in_stack_00000000);
    bVar1 = helics::Interface::isValid((Interface *)0x1cd65e);
    if (bVar1) {
      pvVar2 = anon_unknown.dwarf_5d1c2::findOrCreatePublication
                         (in_stack_00000038,in_stack_00000030);
    }
    else {
      assignError(local_20,-4,"the specified publication name is a not a valid publication name");
      pvVar2 = (HelicsPublication)0x0;
    }
  }
  else {
    pvVar2 = (HelicsPublication)0x0;
  }
  std::shared_ptr<helics::ValueFederate>::~shared_ptr((shared_ptr<helics::ValueFederate> *)0x1cd72f)
  ;
  return pvVar2;
}

Assistant:

HelicsPublication helicsFederateGetPublication(HelicsFederate fed, const char* key, HelicsError* err)
{
    auto fedObj = getValueFedSharedPtr(fed, err);
    if (!fedObj) {
        return nullptr;
    }
    try {
        auto& pub = fedObj->getPublication(key);
        if (!pub.isValid()) {
            assignError(err, HELICS_ERROR_INVALID_ARGUMENT, invalidPubName);
            return nullptr;
        }
        return findOrCreatePublication(fed, pub);
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
        return nullptr;
    }
    // LCOV_EXCL_STOP
}